

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

IdList * sqlite3IdListAppend(Parse *pParse,IdList *pList,Token *pToken)

{
  char *pcVar1;
  Parse *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  IdList *pNew;
  int i;
  sqlite3 *db;
  IdList *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  int iVar3;
  sqlite3 *db_00;
  IdList *local_18;
  
  db_00 = (sqlite3 *)*in_RDI;
  uVar2 = 0xaaaaaaaa;
  if (in_RSI == 0) {
    local_18 = (IdList *)
               sqlite3DbMallocZero((sqlite3 *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd0),
                                   (u64)in_stack_ffffffffffffffc8);
    if (local_18 == (IdList *)0x0) {
      return (IdList *)0x0;
    }
  }
  else {
    in_stack_ffffffffffffffc8 =
         (IdList *)
         sqlite3DbRealloc(db_00,(void *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd0),
                          0xaaaaaaaaaaaaaaaa);
    local_18 = in_stack_ffffffffffffffc8;
    if (in_stack_ffffffffffffffc8 == (IdList *)0x0) {
      sqlite3IdListDelete((sqlite3 *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),(IdList *)0x0);
      return (IdList *)0x0;
    }
  }
  iVar3 = local_18->nId;
  local_18->nId = iVar3 + 1;
  pcVar1 = sqlite3NameFromToken
                     ((sqlite3 *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                      (Token *)in_stack_ffffffffffffffc8);
  local_18->a[iVar3].zName = pcVar1;
  if ((1 < *(byte *)((long)in_RDI + 0x134)) && (local_18->a[iVar3].zName != (char *)0x0)) {
    sqlite3RenameTokenMap(in_RDX,db_00,(Token *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListAppend(Parse *pParse, IdList *pList, Token *pToken){
  sqlite3 *db = pParse->db;
  int i;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(IdList) );
    if( pList==0 ) return 0;
  }else{
    IdList *pNew;
    pNew = sqlite3DbRealloc(db, pList,
                 sizeof(IdList) + pList->nId*sizeof(pList->a));
    if( pNew==0 ){
      sqlite3IdListDelete(db, pList);
      return 0;
    }
    pList = pNew;
  }
  i = pList->nId++;
  pList->a[i].zName = sqlite3NameFromToken(db, pToken);
  if( IN_RENAME_OBJECT && pList->a[i].zName ){
    sqlite3RenameTokenMap(pParse, (void*)pList->a[i].zName, pToken);
  }
  return pList;
}